

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O0

bool CompilationFails(string_view str)

{
  string_view str_00;
  undefined8 uVar1;
  undefined8 uVar2;
  string local_c0 [55];
  allocator<char> local_89;
  string local_88 [32];
  StringTestingBuilder *local_68;
  char *pcStack_60;
  undefined1 local_50 [8];
  string result;
  undefined1 local_28 [8];
  C<StringTestingBuilder,_Policy> compiler;
  string_view str_local;
  
  compiler.builder = (StringTestingBuilder *)str._M_len;
  trivialre::re_compiler::C<StringTestingBuilder,_Policy>::C
            ((C<StringTestingBuilder,_Policy> *)local_28,
             (StringTestingBuilder *)(result.field_2._M_local_buf + 0xf));
  local_68 = compiler.builder;
  str_00._M_str = str._M_str;
  str_00._M_len = (size_t)compiler.builder;
  pcStack_60 = str._M_str;
  trivialre::re_compiler::
  C<StringTestingBuilder,CompilationFails(std::basic_string_view<char,std::char_traits<char>>)::Policy>
  ::CompileOrDie_abi_cxx11_
            ((Matcher *)local_50,
             (C<StringTestingBuilder,CompilationFails(std::basic_string_view<char,std::char_traits<char>>)::Policy>
              *)local_28,str_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_88,(basic_string_view<char,_std::char_traits<char>_> *)&compiler.builder,
             &local_89);
  uVar1 = std::__cxx11::string::c_str();
  std::__cxx11::string::string(local_c0,(string *)local_50);
  uVar2 = std::__cxx11::string::c_str();
  printf("for failing: %s -> %s\n",uVar1,uVar2);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(local_28[0] & 1);
}

Assistant:

bool CompilationFails(std::string_view str) {
  struct Policy {
    bool failed{};
    void NoteError(std::string_view msg, std::string_view at) { failed = true; }
    void StartedParsing(std::string_view str) {}
  };
  trivialre::re_compiler::C<StringTestingBuilder, Policy> compiler({});
  std::string result = compiler.CompileOrDie(str);
  printf("for failing: %s -> %s\n", std::string(str).c_str(), std::string(result).c_str());
  return compiler.failed;
}